

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O2

void __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
::clear(lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
        *this)

{
  bool bVar1;
  consume_operation consume;
  consume_operation local_28;
  
  local_28.m_consume_data.m_queue =
       (LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
        *)0x0;
  local_28.m_consume_data.m_control = (ControlBlock *)0x0;
  local_28.m_consume_data.m_next_ptr = 0;
  while( true ) {
    bVar1 = try_start_consume(this,&local_28);
    if (!bVar1) break;
    consume_operation::commit(&local_28);
  }
  consume_operation::~consume_operation(&local_28);
  return;
}

Assistant:

void clear() noexcept
        {
            consume_operation consume;
            while (try_start_consume(consume))
            {
                consume.commit();
            }
        }